

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

void __thiscall CaDiCaL::Solver::transition_to_steady_state(Solver *this)

{
  State SVar1;
  Internal *this_00;
  
  SVar1 = this->_state;
  if ((SVar1 == UNSATISFIED) || (SVar1 == SATISFIED)) {
    External::reset_assumptions(this->external);
    External::reset_concluded(this->external);
    External::reset_constraint(this->external);
  }
  else if (((SVar1 == CONFIGURING) && (this_00 = this->internal, (this_00->opts).check != 0)) &&
          ((this_00->opts).checkproof != 0)) {
    Internal::check(this_00);
  }
  if (this->_state != STEADY) {
    this->_state = STEADY;
  }
  return;
}

Assistant:

void Solver::transition_to_steady_state () {
  if (state () == CONFIGURING) {
    LOG ("API leaves state %sCONFIGURING%s", tout.emph_code (),
         tout.normal_code ());
    if (internal->opts.check && internal->opts.checkproof) {
      internal->check ();
    }
  } else if (state () == SATISFIED) {
    LOG ("API leaves state %sSATISFIED%s", tout.emph_code (),
         tout.normal_code ());
    external->reset_assumptions ();
    external->reset_concluded ();
    external->reset_constraint ();
  } else if (state () == UNSATISFIED) {
    LOG ("API leaves state %sUNSATISFIED%s", tout.emph_code (),
         tout.normal_code ());
    external->reset_assumptions ();
    external->reset_concluded ();
    external->reset_constraint ();
  }
  if (state () != STEADY)
    STATE (STEADY);
}